

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_easysrc.c
# Opt level: O2

void dumpeasysrc(GlobalConfig *config)

{
  char *__filename;
  curl_slist *pcVar1;
  bool bVar2;
  FILE *__stream;
  long lVar3;
  slist_wc *psVar4;
  
  __filename = config->libcurl;
  if ((*__filename == '-') && (__filename[1] == '\0')) {
    bVar2 = true;
    __stream = _stdout;
  }
  else {
    __stream = fopen64(__filename,"w");
    bVar2 = false;
  }
  if (__stream == (FILE *)0x0) {
    warnf(config,"Failed to open %s to write libcurl code!\n",__filename);
  }
  else {
    for (lVar3 = 0; lVar3 != 0x50; lVar3 = lVar3 + 8) {
      curl_mfprintf(__stream,"%s\n",*(undefined8 *)((long)srchead + lVar3));
    }
    psVar4 = easysrc_decl;
    if (easysrc_decl != (slist_wc *)0x0) {
      while (pcVar1 = psVar4->first, pcVar1 != (curl_slist *)0x0) {
        curl_mfprintf(__stream,"  %s\n",pcVar1->data);
        psVar4 = (slist_wc *)&pcVar1->next;
      }
    }
    if (easysrc_data != (slist_wc *)0x0) {
      curl_mfprintf(__stream,"\n");
      psVar4 = easysrc_data;
      while (pcVar1 = psVar4->first, pcVar1 != (curl_slist *)0x0) {
        curl_mfprintf(__stream,"  %s\n",pcVar1->data);
        psVar4 = (slist_wc *)&pcVar1->next;
      }
    }
    curl_mfprintf(__stream,"\n");
    psVar4 = easysrc_code;
    if (easysrc_code != (slist_wc *)0x0) {
      while (pcVar1 = psVar4->first, pcVar1 != (curl_slist *)0x0) {
        if (*pcVar1->data == '\0') {
          curl_mfprintf(__stream,"\n");
        }
        else {
          curl_mfprintf(__stream,"  %s\n");
        }
        psVar4 = (slist_wc *)&pcVar1->next;
      }
    }
    psVar4 = easysrc_clean;
    if (easysrc_clean != (slist_wc *)0x0) {
      while (pcVar1 = psVar4->first, pcVar1 != (curl_slist *)0x0) {
        curl_mfprintf(__stream,"  %s\n",pcVar1->data);
        psVar4 = (slist_wc *)&pcVar1->next;
      }
    }
    for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 8) {
      curl_mfprintf(__stream,"%s\n",*(undefined8 *)((long)srcend + lVar3));
    }
    if (!bVar2) {
      fclose(__stream);
    }
  }
  easysrc_free();
  return;
}

Assistant:

void dumpeasysrc(struct GlobalConfig *config)
{
  struct curl_slist *ptr;
  char *o = config->libcurl;

  FILE *out;
  bool fopened = FALSE;
  if(strcmp(o, "-")) {
    out = fopen(o, FOPEN_WRITETEXT);
    fopened = TRUE;
  }
  else
    out = stdout;
  if(!out)
    warnf(config, "Failed to open %s to write libcurl code!\n", o);
  else {
    int i;
    const char *c;

    for(i = 0; ((c = srchead[i]) != NULL); i++)
      fprintf(out, "%s\n", c);

    /* Declare variables used for complex setopt values */
    if(easysrc_decl) {
      for(ptr = easysrc_decl->first; ptr; ptr = ptr->next)
        fprintf(out, "  %s\n", ptr->data);
    }

    /* Set up complex values for setopt calls */
    if(easysrc_data) {
      fprintf(out, "\n");

      for(ptr = easysrc_data->first; ptr; ptr = ptr->next)
        fprintf(out, "  %s\n", ptr->data);
    }

    fprintf(out, "\n");
    if(easysrc_code) {
      for(ptr = easysrc_code->first; ptr; ptr = ptr->next) {
        if(ptr->data[0]) {
          fprintf(out, "  %s\n", ptr->data);
        }
        else {
          fprintf(out, "\n");
        }
      }
    }

    if(easysrc_clean) {
      for(ptr = easysrc_clean->first; ptr; ptr = ptr->next)
        fprintf(out, "  %s\n", ptr->data);
    }

    for(i = 0; ((c = srcend[i]) != NULL); i++)
      fprintf(out, "%s\n", c);

    if(fopened)
      fclose(out);
  }

  easysrc_free();
}